

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int fits_uncompress_hkdata(ParseData *lParse,fitsfile *fptr,long ntimes,double *times,int *status)

{
  iteratorCol *piVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  fitsfile *fptr_00;
  long lVar6;
  ulong uVar7;
  char *err_message;
  long lVar8;
  long lVar9;
  double dVar10;
  bool bVar11;
  int anynul;
  fitsfile *local_568;
  double local_560;
  long local_558;
  int *local_550;
  long local_548;
  double local_540;
  double *local_538;
  double newtime;
  long naxis2;
  char *sPtr [1];
  char parName [256];
  char found [1000];
  
  sPtr[0] = parName;
  lVar5 = (long)lParse->nCols;
  while (lVar5 != 0) {
    parName[lVar5 + 0xff] = '\0';
    lVar5 = lVar5 + -1;
  }
  local_548 = ntimes;
  local_538 = times;
  iVar4 = ffgkyj(fptr,"NAXIS2",&naxis2,(char *)0x0,status);
  if (iVar4 == 0) {
    lVar5 = 1;
    lVar6 = 0;
    dVar10 = -1e+38;
    local_568 = fptr;
    local_550 = status;
    while (status = local_550, fptr_00 = local_568, lVar5 <= naxis2) {
      local_560 = dVar10;
      iVar4 = ffgcvd(local_568,lParse->timeCol,lVar5,1,1,0.0,&newtime,&anynul,local_550);
      if (iVar4 != 0) goto LAB_001235df;
      local_540 = newtime;
      local_558 = lVar5;
      if ((newtime != local_560) || (dVar10 = (double)lVar6, NAN(newtime) || NAN(local_560))) {
        if (lVar6 == local_548) {
          err_message = "Found more unique time stamps than caller indicated";
          goto LAB_001238b1;
        }
        local_560 = (double)(lVar6 + 1);
        local_538[lVar6] = newtime;
        lVar5 = (long)lParse->nCols;
        lVar8 = lVar5 * 0x110 + -0xb0;
        while (dVar10 = local_560, bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
          piVar1 = lParse->colData;
          iVar4 = *(int *)(piVar1->colname + lVar8 + -0x18);
          if (iVar4 == 0x10) {
            strcpy(*(char **)(*(long *)(piVar1->colname + lVar8 + -0xc) + 8 + lVar6 * 8),
                   *(char **)(*(long *)(piVar1->colname + lVar8 + -0xc) + lVar6 * 8));
          }
          else if (iVar4 == 0x29) {
            *(undefined8 *)(*(long *)(piVar1->colname + lVar8 + -0xc) + 8 + lVar6 * 8) =
                 *(undefined8 *)(*(long *)(piVar1->colname + lVar8 + -0xc) + lVar6 * 8);
          }
          else if (iVar4 == 0x52) {
            *(undefined8 *)(*(long *)(piVar1->colname + lVar8 + -0xc) + 8 + lVar6 * 8) =
                 *(undefined8 *)(*(long *)(piVar1->colname + lVar8 + -0xc) + lVar6 * 8);
          }
          lVar8 = lVar8 + -0x110;
        }
        local_560 = local_540;
        fptr_00 = local_568;
      }
      iVar4 = ffgcvs(fptr_00,lParse->parCol,local_558,1,1,"",sPtr,&anynul,status);
      if (iVar4 != 0) goto LAB_001235df;
      lVar6 = (long)lParse->nCols;
      lVar8 = 0;
      lVar5 = lVar6 * 0xa0;
      do {
        if (lVar6 == lVar8) goto LAB_0012387d;
        iVar4 = fits_strcasecmp(parName,lParse->varData[-1].name + lVar5);
        piVar3 = local_550;
        lVar8 = lVar8 + 1;
        lVar5 = lVar5 + -0xa0;
      } while (iVar4 != 0);
      uVar7 = lVar6 - lVar8;
      if (uVar7 != 0xffffffffffffffff && -1 < (long)(uVar7 + 1)) {
        uVar7 = uVar7 & 0xffffffff;
        found[uVar7] = '\x01';
        piVar1 = lParse->colData;
        iVar4 = piVar1[uVar7].datatype;
        if (iVar4 == 0x10) {
          ffgcvs(local_568,lParse->valCol,local_558,1,1,*piVar1[uVar7].array,
                 (char **)((long)piVar1[uVar7].array + dVar10 * 8),&anynul,local_550);
        }
        else if (iVar4 == 0x52) {
          ffgcvd(local_568,lParse->valCol,local_558,1,1,*piVar1[uVar7].array,
                 (double *)((long)piVar1[uVar7].array + dVar10 * 8),&anynul,local_550);
        }
        else if (iVar4 == 0x29) {
          ffgcvj(local_568,lParse->valCol,local_558,1,1,*piVar1[uVar7].array,
                 (long *)((long)piVar1[uVar7].array + dVar10 * 8),&anynul,local_550);
        }
        if (*piVar3 != 0) {
          return *piVar3;
        }
      }
LAB_0012387d:
      lVar6 = (long)dVar10;
      dVar10 = local_560;
      lVar5 = local_558 + 1;
    }
    if (lVar6 < local_548) {
      err_message = "Found fewer unique time stamps than caller indicated";
LAB_001238b1:
      ffpmsg(err_message);
      *status = 0x1b3;
      return 0x1b3;
    }
    lVar5 = (long)lParse->nCols;
    lVar6 = (long)lParse->nCols * 0xa0;
    while( true ) {
      lVar8 = lVar6;
      lVar6 = lVar8 + -0xa0;
      lVar9 = lVar5 + -1;
      if (lVar5 == 0) break;
      lVar2 = lVar5 + 0xff;
      lVar5 = lVar9;
      if (parName[lVar2] == '\0') {
        snprintf(parName,0x100,"Parameter not found: %-30s",lParse->varData[-1].name + lVar8);
        ffpmsg(parName);
        *status = 0x1af;
      }
    }
  }
LAB_001235df:
  return *status;
}

Assistant:

int fits_uncompress_hkdata( ParseData *lParse,
		       fitsfile *fptr,
                       long     ntimes,
                       double   *times,
                       int      *status )
/*                                                                           */
/* description                                                               */
/*---------------------------------------------------------------------------*/
{
   char parName[256], *sPtr[1], found[1000];
   int parNo, anynul;
   long naxis2, row, currelem;
   double currtime, newtime;

   sPtr[0] = parName;
   currelem = 0;
   currtime = -1e38;

   parNo=lParse->nCols;
   while( parNo-- ) found[parNo] = 0;

   if( ffgkyj( fptr, "NAXIS2", &naxis2, NULL, status ) ) return( *status );

   for( row=1; row<=naxis2; row++ ) {
      if( ffgcvd( fptr, lParse->timeCol, row, 1L, 1L, 0.0,
                  &newtime, &anynul, status ) ) return( *status );
      if( newtime != currtime ) {
         /*  New time encountered... propogate parameters to next row  */
         if( currelem==ntimes ) {
            ffpmsg("Found more unique time stamps than caller indicated");
            return( *status = PARSE_BAD_COL );
         }
         times[currelem++] = currtime = newtime;
         parNo = lParse->nCols;
         while( parNo-- ) {
            switch( lParse->colData[parNo].datatype ) {
            case TLONG:
               ((long*)lParse->colData[parNo].array)[currelem] =
                  ((long*)lParse->colData[parNo].array)[currelem-1];
               break;
            case TDOUBLE:
               ((double*)lParse->colData[parNo].array)[currelem] =
                  ((double*)lParse->colData[parNo].array)[currelem-1];
               break;
            case TSTRING:
               strcpy( ((char **)lParse->colData[parNo].array)[currelem],
                       ((char **)lParse->colData[parNo].array)[currelem-1] );
               break;
            }
         }
      }

      if( ffgcvs( fptr, lParse->parCol, row, 1L, 1L, "",
                  sPtr, &anynul, status ) ) return( *status );
      parNo = lParse->nCols;
      while( parNo-- )
         if( !fits_strcasecmp( parName, lParse->varData[parNo].name ) ) break;

      if( parNo>=0 ) {
         found[parNo] = 1; /* Flag this parameter as found */
         switch( lParse->colData[parNo].datatype ) {
         case TLONG:
            ffgcvj( fptr, lParse->valCol, row, 1L, 1L,
                    ((long*)lParse->colData[parNo].array)[0],
                    ((long*)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         case TDOUBLE:
            ffgcvd( fptr, lParse->valCol, row, 1L, 1L,
                    ((double*)lParse->colData[parNo].array)[0],
                    ((double*)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         case TSTRING:
            ffgcvs( fptr, lParse->valCol, row, 1L, 1L,
                    ((char**)lParse->colData[parNo].array)[0],
                    ((char**)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         }
         if( *status ) return( *status );
      }
   }

   if( currelem<ntimes ) {
      ffpmsg("Found fewer unique time stamps than caller indicated");
      return( *status = PARSE_BAD_COL );
   }

   /*  Check for any parameters which were not located in the table  */
   parNo = lParse->nCols;
   while( parNo-- )
      if( !found[parNo] ) {
         snprintf( parName, 256, "Parameter not found: %-30s", 
                  lParse->varData[parNo].name );
         ffpmsg( parName );
         *status = PARSE_SYNTAX_ERR;
      }
   return( *status );
}